

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx,uchar *output)

{
  int iVar1;
  void *pvVar2;
  uchar *opad;
  uchar tmp [64];
  uchar *output_local;
  mbedtls_md_context_t *ctx_local;
  
  if (((ctx == (mbedtls_md_context_t *)0x0) || (ctx->md_info == (mbedtls_md_info_t *)0x0)) ||
     (ctx->hmac_ctx == (void *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    pvVar2 = ctx->hmac_ctx;
    iVar1 = ctx->md_info->block_size;
    (*ctx->md_info->finish_func)(ctx->md_ctx,(uchar *)&opad);
    (*ctx->md_info->starts_func)(ctx->md_ctx);
    (*ctx->md_info->update_func)
              (ctx->md_ctx,(uchar *)((long)pvVar2 + (long)iVar1),(long)ctx->md_info->block_size);
    (*ctx->md_info->update_func)(ctx->md_ctx,(uchar *)&opad,(long)ctx->md_info->size);
    (*ctx->md_info->finish_func)(ctx->md_ctx,output);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_hmac_finish( mbedtls_md_context_t *ctx, unsigned char *output )
{
    unsigned char tmp[MBEDTLS_MD_MAX_SIZE];
    unsigned char *opad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    ctx->md_info->finish_func( ctx->md_ctx, tmp );
    ctx->md_info->starts_func( ctx->md_ctx );
    ctx->md_info->update_func( ctx->md_ctx, opad, ctx->md_info->block_size );
    ctx->md_info->update_func( ctx->md_ctx, tmp, ctx->md_info->size );
    ctx->md_info->finish_func( ctx->md_ctx, output );

    return( 0 );
}